

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O2

vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *
Rotate_BSpline(vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>
               *__return_storage_ptr__,Vector3f *o,
              vector<Vector2f,_std::allocator<Vector2f>_> *controls,Material *m,int K)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pvVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Rotate_BSpline_Segment *this;
  vector<Vector2f,_std::allocator<Vector2f>_> *t_00;
  vector<Vector2f,_std::allocator<Vector2f>_> *t_01;
  vector<Vector2f,_std::allocator<Vector2f>_> *t_02;
  vector<Vector2f,_std::allocator<Vector2f>_> *t_03;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 in_XMM3_Qb;
  initializer_list<Vector2f> __l;
  initializer_list<Vector2f> __l_00;
  allocator_type local_332;
  allocator_type local_331;
  vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *local_330;
  ulong local_328;
  double local_320;
  int local_318;
  float local_314;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  f;
  ulong local_2f8;
  vector<Vector2f,_std::allocator<Vector2f>_> t;
  Rotate_BSpline_Segment *s_p;
  Vector2f local_2a0;
  double local_298;
  double dStack_290;
  vector<Vector2f,_std::allocator<Vector2f>_> v;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_238;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_220;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_208;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_1f0;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_1d8;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_1c0;
  undefined1 local_1a8 [16];
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_190;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_178;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_160;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_148;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_130;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_118;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_100;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_e8;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_d0;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_b8;
  Vector2f local_a0;
  Vector2f local_98;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_90;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_78;
  _Vector_base<Vector2f,_std::allocator<Vector2f>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  uVar2 = (uint)((ulong)((long)(controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar7 = uVar2 + K;
  local_318 = iVar7;
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::vector(&f,(long)iVar7,(allocator_type *)&t);
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar15 = (double)iVar7;
  local_314 = (float)K;
  local_330 = __return_storage_ptr__;
  local_328 = (ulong)(uint)K;
  local_2f8 = (ulong)(uint)K;
  local_298 = dVar15;
  dStack_290 = dVar15;
  while( true ) {
    uVar8 = (uint)local_2f8;
    if ((int)uVar2 <= (int)uVar8) break;
    auVar14 = vpinsrd_avx(ZEXT416(uVar8),uVar8 + 1,1);
    auVar14 = vcvtdq2pd_avx(auVar14);
    auVar3._8_8_ = dStack_290;
    auVar3._0_8_ = local_298;
    auVar14 = vdivpd_avx(auVar14,auVar3);
    local_1a8 = vcvtpd2ps_avx(auVar14);
    lVar13 = 8;
    for (uVar11 = 0;
        pvVar6 = f.
                 super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (long)uVar11 <= (long)(int)((uVar2 - 1) + K); uVar11 = uVar11 + 1) {
      lVar12 = *(long *)((long)f.
                               super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
      if (*(long *)((long)&((f.
                             super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar13) != lVar12) {
        *(long *)((long)&((f.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar13) = lVar12;
      }
      if (local_2f8 == uVar11) {
        Vector2f::Vector2f((Vector2f *)&t,1.0);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::emplace_back<Vector2f>
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)((long)pvVar6 + lVar13 + -8),
                   (Vector2f *)&t);
      }
      lVar13 = lVar13 + 0x18;
    }
    t.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    t.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    t.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar7 = 2;
    for (uVar11 = 1; uVar11 != (~(K >> 0x1f) & K) + 1; uVar11 = uVar11 + 1) {
      if (uVar11 == local_328) {
        lVar12 = 0;
        for (lVar13 = 0; lVar13 < (int)uVar2; lVar13 = lVar13 + 1) {
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_b8,&t);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_d0,
                     (vector<Vector2f,_std::allocator<Vector2f>_> *)
                     ((long)&((f.
                               super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar12));
          iVar9 = (int)lVar13;
          auVar14 = vpinsrd_avx(ZEXT416((uint)((int)local_328 + iVar9)),iVar9,1);
          auVar14 = vcvtudq2pd_avx512vl(auVar14);
          auVar4._8_8_ = dStack_290;
          auVar4._0_8_ = local_298;
          auVar14 = vdivpd_avx(auVar14,auVar4);
          auVar14 = vhsubpd_avx(auVar14,auVar14);
          poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_1d8,
                             (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_d0,
                             1.0 / auVar14._0_8_);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_100,
                     (vector<Vector2f,_std::allocator<Vector2f>_> *)
                     ((long)&f.
                             super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12));
          auVar14 = vpinsrd_avx(ZEXT416((uint)(iVar9 + 1 + (int)local_328)),iVar9 + 1,1);
          auVar14 = vcvtudq2pd_avx512vl(auVar14);
          auVar5._8_8_ = dStack_290;
          auVar5._0_8_ = local_298;
          auVar14 = vdivpd_avx(auVar14,auVar5);
          auVar14 = vhsubpd_avx(auVar14,auVar14);
          poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_e8,
                             (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_100,
                             1.0 / auVar14._0_8_);
          poly_minus<Vector2f>
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_1c0,
                     (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_1d8,
                     (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_e8);
          operator*(&local_98,local_314);
          poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_60,
                             (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_1c0,&local_98);
          poly_add<Vector2f>(&v,(vector<Vector2f,_std::allocator<Vector2f>_> *)&local_b8,
                             (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_60);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::_M_move_assign
                    (&t,(anon_class_1_0_00000001 *)&v);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base
                    ((_Vector_base<Vector2f,_std::allocator<Vector2f>_> *)&v);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_60);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_1c0);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_e8);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_100);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_1d8);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_d0);
          std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_b8);
          lVar12 = lVar12 + 0x18;
        }
      }
      lVar13 = 0;
      iVar9 = local_318 - (int)uVar11;
      for (lVar12 = 0; lVar12 < iVar9; lVar12 = lVar12 + 1) {
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_1f0,
                   (vector<Vector2f,_std::allocator<Vector2f>_> *)
                   ((long)&((f.
                             super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar13));
        iVar10 = (int)lVar12;
        auVar16._0_8_ = (double)iVar10 / dVar15;
        auVar16._8_8_ = in_XMM3_Qb;
        auVar17._0_4_ = (float)auVar16._0_8_;
        auVar17._4_12_ = auVar16._4_12_;
        auVar1._8_4_ = 0x80000000;
        auVar1._0_8_ = 0x8000000080000000;
        auVar1._12_4_ = 0x80000000;
        auVar14 = vxorps_avx512vl(auVar17,auVar1);
        local_320 = auVar16._0_8_;
        Vector2f::Vector2f((Vector2f *)&local_238,auVar14._0_4_,auVar14._0_4_);
        Vector2f::Vector2f((Vector2f *)&local_238._M_impl.super__Vector_impl_data._M_finish,1.0,1.0)
        ;
        __l._M_len = 2;
        __l._M_array = (iterator)&local_238;
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_148,__l,&local_331);
        poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_130,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_148,
                           1.0 / ((double)((int)uVar11 + iVar10) / dVar15 - local_320));
        poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_118,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_1f0,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_130);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_208,
                   (vector<Vector2f,_std::allocator<Vector2f>_> *)
                   ((long)&f.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar13));
        local_320 = (double)(iVar7 + iVar10) / dVar15;
        Vector2f::Vector2f((Vector2f *)&s_p,(float)local_320,(float)local_320);
        Vector2f::Vector2f(&local_2a0,-1.0,-1.0);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&s_p;
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_178,__l_00,&local_332);
        poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_160,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_178,
                           1.0 / (local_320 - (double)(iVar10 + 1) / dVar15));
        poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_78,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_208,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_160);
        poly_add<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)
                           &v.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_118,
                           (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_78);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::_M_move_assign
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)
                   ((long)&((f.
                             super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar13),
                   &v.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base
                  (&v.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_78);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_160);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_178);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_208);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_118);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_130);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_148);
        std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_1f0);
        lVar13 = lVar13 + 0x18;
      }
      iVar7 = iVar7 + 1;
    }
    v.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar12 = 0;
    v.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    v.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (lVar13 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) << 3 != lVar13; lVar13 = lVar13 + 8) {
      std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_190,&v);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_220,
                 (vector<Vector2f,_std::allocator<Vector2f>_> *)
                 ((long)&((f.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar12));
      Vector2f::Vector2f(&local_a0,
                         (Vector2f *)
                         ((long)((controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)
                                 ._M_impl.super__Vector_impl_data._M_start)->m_elements + lVar13));
      poly_mul<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_90,
                         (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_220,&local_a0);
      poly_add<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)&local_238,
                         (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_190,
                         (vector<Vector2f,_std::allocator<Vector2f>_> *)&local_90);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::_M_move_assign(&v,&local_238);
      std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_238);
      std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_90);
      std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_220);
      std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base(&local_190);
      lVar12 = lVar12 + 0x18;
    }
    this = (Rotate_BSpline_Segment *)operator_new(0xb0);
    Rotate_BSpline_Segment::Rotate_BSpline_Segment(this,m);
    s_p = this;
    Vector3f::operator=(&this->o,o);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              ((vector<double,_std::allocator<double>_> *)&local_238,(anon_class_1_0_00000001 *)&v,
               t_00);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->px,&local_238);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_238);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              ((vector<double,_std::allocator<double>_> *)&local_238,(anon_class_1_0_00000001 *)&v,
               t_01);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->py,&local_238);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_238);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              ((vector<double,_std::allocator<double>_> *)&local_48,(anon_class_1_0_00000001 *)&t,
               t_02);
    poly_neg<double>((vector<double,_std::allocator<double>_> *)&local_48);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->nx,&local_238);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_238);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              ((vector<double,_std::allocator<double>_> *)&local_238,(anon_class_1_0_00000001 *)&t,
               t_03);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->ny,&local_238);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_238);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_1a8._0_8_;
    auVar14 = vcvtps2pd_avx(auVar14);
    this->l = (double)auVar14._0_8_;
    this->r = (double)auVar14._8_8_;
    std::vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>::push_back
              (local_330,&s_p);
    std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base
              ((_Vector_base<Vector2f,_std::allocator<Vector2f>_> *)&v);
    std::_Vector_base<Vector2f,_std::allocator<Vector2f>_>::~_Vector_base
              ((_Vector_base<Vector2f,_std::allocator<Vector2f>_> *)&t);
    local_2f8 = (ulong)(uVar8 + 1);
  }
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::~vector(&f);
  return local_330;
}

Assistant:

std::vector<Rotate_BSpline_Segment*> Rotate_BSpline(Vector3f o, std::vector<Vector2f> controls, Material* m, int K=3) {
//	cout << o[0] << ',' << o[1] << "," << o[2] << " | " << controls.size() << "  |  " << m<<" " << K << "?\n";
//	for (auto t : controls) cout << t[0] << "," << t[1] << " "; cout << "?\n";
	using std::vector;
	int N = int(controls.size()) - 1;
	auto tt = [&](int w) {return w * 1.0 / (N + K + 1); };
	vector<vector<Vector2f>> f(N + K + 1);
	std::vector<Rotate_BSpline_Segment*> output;
	for (int g = K; g <= N; ++g) {
		float l = tt(g), r = tt(g + 1);
		for (int j = 0; j < N + K + 1; ++j)
		{
			f[j].clear();
			if (g == j) f[j].push_back(1);
		}
		vector<Vector2f> t;
		for (int x = 1; x <= K; ++x)
		{
			if (x == K)
			{
				for (int j = 0; j < N + K + 1 - x; ++j)
					t = poly_add(t, poly_mul(poly_minus(
						poly_mul(f[j], 1.0 / (tt(j + x) - tt(j))), 
						poly_mul(f[j + 1], 1.0 / (tt(j + x + 1) - tt(j + 1)))), 
						controls[j] * x));
			}
			for (int j = 0; j < N + K + 1 - x; ++j)
				f[j] = poly_add(poly_mul(f[j], poly_mul(
					std::vector<Vector2f>{ Vector2f(-tt(j),-tt(j)),Vector2f(1,1) }, 1.0 / (tt(j + x) - tt(j)))),
				poly_mul(f[j + 1], poly_mul(std::vector<Vector2f>{ 
					Vector2f(tt(j + x + 1), tt(j + x + 1)),Vector2f(-1,-1) }, 1.0 / (tt(j + x + 1) - tt(j + 1)))));
//				f[j] = (g - tt(j)) / (tt(j + x) - tt(j)) * f[j] + (tt(j + x + 1) - g) / (tt(j + x + 1) - tt(j + 1)) * f[j + 1];
		}
		vector<Vector2f> v;
		for (int j = 0; j <= N; ++j)
			v = poly_add(v, poly_mul(f[j], controls[j]));
		auto gx = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[0]);
			return s;
		};
		auto gy = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[1]);
			return s;
		};
		Rotate_BSpline_Segment *s_p=new Rotate_BSpline_Segment(m),&s=*s_p;
		s.o = o; s.px = gx(v); s.py = gy(v);
		s.nx = poly_neg(gy(t)); s.ny = gx(t);
		s.l = l; s.r = r; output.push_back(s_p);
	}
//	cerr << K << "," << N << " " << output.size() << "?\n";
	return output;
}